

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhereState.hpp
# Opt level: O3

void __thiscall
linq::
WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
::Advance(WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
          *this)

{
  int iVar1;
  element_type *peVar2;
  
  peVar2 = (this->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  while( true ) {
    (*peVar2->_vptr_IState[2])();
    iVar1 = (*((this->source).state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[1])();
    if ((char)iVar1 == '\0') {
      return;
    }
    iVar1 = (*((this->source).state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[3])();
    if (iVar1 - 3U < 8) break;
    peVar2 = (this->source).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
  }
  return;
}

Assistant:

void Advance() final override 
			{
				source.Advance();

				while(source.Valid() && !filter(source.Current()))
					source.Advance();
			}